

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexScreenTile(void)

{
  bool bVar1;
  aint bankIndex;
  bool local_2d [5];
  undefined4 uStack_28;
  bool optionals [5];
  aint tileArgs [5];
  
  _uStack_28 = 0;
  local_2d[0] = false;
  local_2d[1] = false;
  local_2d[2] = false;
  local_2d[3] = false;
  local_2d[4] = true;
  bVar1 = getIntArguments<5>(&lp,(aint (*) [5])&stack0xffffffffffffffd8,&local_2d);
  if ((((bVar1) && (-1 < (int)uStack_28)) && ((int)uStack_28 < 0x100)) &&
     ((-1 < _uStack_28 && ((int)optionals._1_4_ < 0x100)))) {
    if (nex.reqFileVersion == 2) {
      Error("[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.",
            (char *)0x0,SUPPRESS);
    }
    else {
      nex.minFileVersion = 3;
      SNexFile::writePalette(&nex);
      nex.h.screen = nex.h.screen | 0x40;
      nex.h.screen2 = '\x03';
      nex.h.tilesScrConfig[0] = (byte)_uStack_28;
      nex.h.tilesScrConfig[1] = (byte)((ulong)_uStack_28 >> 0x20);
      nex.h.tilesScrConfig[2] = '\0';
      nex.h.tilesScrConfig[3] = '\0';
      bankIndex = getNexBankIndex(5);
      saveBank(bankIndex,5,false);
    }
  }
  else {
    Error("[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]"
          ,bp,SUPPRESS);
  }
  return;
}

Assistant:

static void dirNexScreenTile() {
// ;; SCREEN TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]
	// parse arguments
	aint tileArgs[5] = {0, 0, 0, 0, 1};
	const bool optionals[] = {false, false, false, false, true};
	if (!getIntArguments<5>(lp, tileArgs, optionals)
			|| tileArgs[0] < 0 || 255 < tileArgs[0]
			|| tileArgs[1] < 0 || 255 < tileArgs[1]
			|| tileArgs[2] < 0 || 255 < tileArgs[2]
			|| tileArgs[3] < 0 || 255 < tileArgs[3]
			|| tileArgs[4] < 0 || 1 < tileArgs[4]) {
		Error("[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]", bp, SUPPRESS);
		return;
	}
	// check file version and set it up to V1.3
	if (2 == nex.reqFileVersion) {
		Error("[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.", NULL, SUPPRESS);
		return;
	}
	nex.minFileVersion = 3;
	// write palette into file (or update nex.h.screen with NOPAL flag if no palette was defined)
	nex.writePalette();
	nex.h.screen |= SNexHeader::SCR_EXT2;
	nex.h.screen2 = SNexHeader::SCR2_tilemap;
	nex.h.tilesScrConfig[0] = static_cast<byte>(tileArgs[0]);
	nex.h.tilesScrConfig[1] = static_cast<byte>(tileArgs[1]);
	nex.h.tilesScrConfig[2] = static_cast<byte>(tileArgs[2]);
	nex.h.tilesScrConfig[3] = static_cast<byte>(tileArgs[3]);
	// write Bank 5 into file, if requested/default
	if (0 == tileArgs[4]) return;		// suppressed
	saveBank(getNexBankIndex(5), 5);
}